

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

target_long_conflict decode_sleb128(uint8_t **pp)

{
  byte bVar1;
  byte *pbVar2;
  int local_24;
  int shift;
  int byte;
  target_long_conflict val;
  uint8_t *p;
  uint8_t **pp_local;
  
  shift = 0;
  local_24 = 0;
  _byte = *pp;
  do {
    pbVar2 = _byte + 1;
    bVar1 = *_byte;
    shift = (bVar1 & 0x7f) << ((byte)local_24 & 0x1f) | shift;
    local_24 = local_24 + 7;
    _byte = pbVar2;
  } while ((bVar1 & 0x80) != 0);
  if ((local_24 < 0x20) && ((bVar1 & 0x40) != 0)) {
    shift = -1 << ((byte)local_24 & 0x1f) | shift;
  }
  *pp = pbVar2;
  return shift;
}

Assistant:

static target_long decode_sleb128(uint8_t **pp)
{
    uint8_t *p = *pp;
    target_long val = 0;
    int byte, shift = 0;

    do {
        byte = *p++;
        val |= (target_ulong)(byte & 0x7f) << shift;
        shift += 7;
    } while (byte & 0x80);
    if (shift < TARGET_LONG_BITS && (byte & 0x40)) {
#ifdef _MSC_VER
        val |= ((target_ulong)0 - 1) << shift;
#else
        val |= -(target_ulong)1 << shift;
#endif
    }

    *pp = p;
    return val;
}